

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astSequenceNode_primitiveMacro
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t pragmas;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  sVar1 = sysbvm_macroContext_getSourcePosition(*arguments);
  pragmas = sysbvm_array_create(context,0);
  sVar1 = sysbvm_astSequenceNode_create(context,sVar1,pragmas,arguments[1]);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_astSequenceNode_primitiveMacro(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *macroContext = &arguments[0];
    sysbvm_tuple_t *bodyNodes = &arguments[1];

    sysbvm_tuple_t sourcePosition = sysbvm_macroContext_getSourcePosition(*macroContext);
    sysbvm_tuple_t pragmas = sysbvm_array_create(context, 0);
    return sysbvm_astSequenceNode_create(context, sourcePosition, pragmas, *bodyNodes);
}